

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O1

int Dar2_LibEval(Gia_Man_t *p,Vec_Int_t *vCutLits,uint uTruth,int fKeepLevel,Vec_Int_t *vLeavesBest2
                )

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  Dar_Lib_t *pDVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  Dar_LibObj_t *pObj;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int local_60;
  int local_5c;
  
  if (vCutLits->nSize != 4) {
    __assert_fail("Vec_IntSize(vCutLits) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x4ab,
                  "int Dar2_LibEval(Gia_Man_t *, Vec_Int_t *, unsigned int, int, Vec_Int_t *)");
  }
  if (0xffff < uTruth) {
    __assert_fail("(uTruth >> 16) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x4ac,
                  "int Dar2_LibEval(Gia_Man_t *, Vec_Int_t *, unsigned int, int, Vec_Int_t *)");
  }
  Dar2_LibCutMatch(p,vCutLits,uTruth);
  bVar1 = s_DarLib->pMap[uTruth];
  Dar2_LibEvalAssignNums(p,(uint)bVar1);
  if (s_DarLib->nSubgr0[bVar1] < 1) {
    local_60 = -1;
  }
  else {
    local_5c = -1000000;
    iVar10 = 1000000;
    local_60 = -1;
    lVar9 = 0;
    do {
      pObj = s_DarLib->pObjs + s_DarLib->pSubgr0[bVar1][lVar9];
      iVar5 = Dar2_LibEval_rec(pObj,(int)lVar9);
      iVar6 = -iVar5;
      if (fKeepLevel == 0) {
        if ((local_5c == iVar6 || SBORROW4(local_5c,iVar6) != local_5c + iVar5 < 0) &&
           ((local_5c != iVar6 || (s_DarLib->pDatas[(ulong)*pObj >> 0x24].Level < iVar10))))
        goto LAB_004f03dc;
      }
      else {
        iVar2 = s_DarLib->pDatas[(ulong)*pObj >> 0x24].Level;
        if ((iVar2 <= iVar10) &&
           ((iVar2 != iVar10 || (SBORROW4(local_5c,iVar6) != local_5c + iVar5 < 0)))) {
LAB_004f03dc:
          vLeavesBest2->nSize = 0;
          pDVar4 = s_DarLib;
          if (0 < vCutLits->nSize) {
            lVar8 = 0;
            lVar11 = 0;
            do {
              iVar10 = *(int *)(pDVar4->pDatas->nLats + lVar8 + -0x15);
              uVar3 = vLeavesBest2->nCap;
              if (vLeavesBest2->nSize == uVar3) {
                if ((int)uVar3 < 0x10) {
                  if (vLeavesBest2->pArray == (int *)0x0) {
                    piVar7 = (int *)malloc(0x40);
                  }
                  else {
                    piVar7 = (int *)realloc(vLeavesBest2->pArray,0x40);
                  }
                  vLeavesBest2->pArray = piVar7;
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar3 * 2;
                  if (iVar5 <= (int)uVar3) goto LAB_004f048b;
                  if (vLeavesBest2->pArray == (int *)0x0) {
                    piVar7 = (int *)malloc((ulong)uVar3 << 3);
                  }
                  else {
                    piVar7 = (int *)realloc(vLeavesBest2->pArray,(ulong)uVar3 << 3);
                  }
                  vLeavesBest2->pArray = piVar7;
                }
                if (piVar7 == (int *)0x0) {
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                vLeavesBest2->nCap = iVar5;
              }
LAB_004f048b:
              iVar5 = vLeavesBest2->nSize;
              vLeavesBest2->nSize = iVar5 + 1;
              vLeavesBest2->pArray[iVar5] = iVar10;
              lVar11 = lVar11 + 1;
              lVar8 = lVar8 + 0x18;
            } while (lVar11 < vCutLits->nSize);
          }
          local_60 = s_DarLib->pSubgr0[bVar1][lVar9];
          iVar10 = s_DarLib->pDatas[(ulong)*pObj >> 0x24].Level;
          local_5c = iVar6;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < s_DarLib->nSubgr0[bVar1]);
  }
  if (local_60 == -1) {
    __assert_fail("p_OutBest != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x4d9,
                  "int Dar2_LibEval(Gia_Man_t *, Vec_Int_t *, unsigned int, int, Vec_Int_t *)");
  }
  return local_60;
}

Assistant:

int Dar2_LibEval( Gia_Man_t * p, Vec_Int_t * vCutLits, unsigned uTruth, int fKeepLevel, Vec_Int_t * vLeavesBest2 )
{
    int p_OutBest    = -1;
    int p_OutNumBest = -1;
    int p_LevelBest  =  1000000;
    int p_GainBest   = -1000000;
    int p_ClassBest  = -1;
//    int fTraining    =  0;
    Dar_LibObj_t * pObj;
    int Out, k, Class, nNodesSaved, nNodesAdded, nNodesGained;
//    abctime clk = Abc_Clock();
    assert( Vec_IntSize(vCutLits) == 4 );
    assert( (uTruth >> 16) == 0 );
    // check if the cut exits and assigns leaves and their levels
    if ( !Dar2_LibCutMatch(p, vCutLits, uTruth) )
        return -1;
    // mark MFFC of the node
//    nNodesSaved = Dar2_LibCutMarkMffc( p->pAig, pRoot, pCut->nLeaves, p->pPars->fPower? &PowerSaved : NULL );
    nNodesSaved = 0;
    // evaluate the cut
    Class = s_DarLib->pMap[uTruth];
    Dar2_LibEvalAssignNums( p, Class );
    // profile outputs by their savings
//    p->nTotalSubgs += s_DarLib->nSubgr0[Class];
//    p->ClassSubgs[Class] += s_DarLib->nSubgr0[Class];
    for ( Out = 0; Out < s_DarLib->nSubgr0[Class]; Out++ )
    {
        pObj = Dar_LibObj(s_DarLib, s_DarLib->pSubgr0[Class][Out]);
//        nNodesAdded = Dar2_LibEval_rec( pObj, Out, nNodesSaved - !p->pPars->fUseZeros, Required, p->pPars->fPower? &PowerAdded : NULL );
        nNodesAdded = Dar2_LibEval_rec( pObj, Out );
        nNodesGained = nNodesSaved - nNodesAdded;
        if ( fKeepLevel )
        {
            if ( s_DarLib->pDatas[pObj->Num].Level >  p_LevelBest || 
                (s_DarLib->pDatas[pObj->Num].Level == p_LevelBest && nNodesGained <= p_GainBest) )
                continue;
        }
        else
        {
            if ( nNodesGained <  p_GainBest || 
                (nNodesGained == p_GainBest && s_DarLib->pDatas[pObj->Num].Level >= p_LevelBest) )
                continue;
        }
        // remember this possibility
        Vec_IntClear( vLeavesBest2 );
        for ( k = 0; k < Vec_IntSize(vCutLits); k++ )
            Vec_IntPush( vLeavesBest2, s_DarLib->pDatas[k].iGunc );
        p_OutBest    = s_DarLib->pSubgr0[Class][Out];
        p_OutNumBest = Out;
        p_LevelBest  = s_DarLib->pDatas[pObj->Num].Level;
        p_GainBest   = nNodesGained;
        p_ClassBest  = Class;
//        assert( p_LevelBest <= Required );
    }
//clk = Abc_Clock() - clk;
//p->ClassTimes[Class] += clk;
//p->timeEval += clk;
    assert( p_OutBest != -1 );
    return p_OutBest;
}